

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O2

string * to_string_abi_cxx11_(string *__return_storage_ptr__,ze_image_format_layout_t layout)

{
  char *pcVar1;
  string local_30;
  
  switch(layout) {
  case ZE_IMAGE_FORMAT_LAYOUT_8:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_8";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_16:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_16";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_32:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_32";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_8_8:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_8_8";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_8_8_8_8:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_8_8_8_8";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_16_16:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_16_16";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_16_16_16_16:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_16_16_16_16";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_32_32:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_32_32";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_32_32_32_32:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_32_32_32_32";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_10_10_10_2:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_10_10_10_2";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_11_11_10:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_11_11_10";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_5_6_5:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_5_6_5";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_5_5_5_1:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_5_5_5_1";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_4_4_4_4:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_4_4_4_4";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_Y8:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_Y8";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_NV12:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_NV12";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_YUYV:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_YUYV";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_VYUY:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_VYUY";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_YVYU:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_YVYU";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_UYVY:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_UYVY";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_AYUV:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_AYUV";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_P010:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_P010";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_Y410:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_Y410";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_P012:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_P012";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_Y16:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_Y16";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_P016:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_P016";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_Y216:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_Y216";
    break;
  case ZE_IMAGE_FORMAT_LAYOUT_P216:
    pcVar1 = "ZE_IMAGE_FORMAT_LAYOUT_P216";
    break;
  default:
    std::__cxx11::to_string(&local_30,layout);
    std::operator+(__return_storage_ptr__,"Unknown ze_image_format_layout_t value: ",&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const ze_image_format_layout_t layout) {
  if (layout == ZE_IMAGE_FORMAT_LAYOUT_8) {
    return "ZE_IMAGE_FORMAT_LAYOUT_8";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_16) {
    return "ZE_IMAGE_FORMAT_LAYOUT_16";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_32) {
    return "ZE_IMAGE_FORMAT_LAYOUT_32";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_8_8) {
    return "ZE_IMAGE_FORMAT_LAYOUT_8_8";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_8_8_8_8) {
    return "ZE_IMAGE_FORMAT_LAYOUT_8_8_8_8";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_16_16) {
    return "ZE_IMAGE_FORMAT_LAYOUT_16_16";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_16_16_16_16) {
    return "ZE_IMAGE_FORMAT_LAYOUT_16_16_16_16";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_32_32) {
    return "ZE_IMAGE_FORMAT_LAYOUT_32_32";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_32_32_32_32) {
    return "ZE_IMAGE_FORMAT_LAYOUT_32_32_32_32";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_10_10_10_2) {
    return "ZE_IMAGE_FORMAT_LAYOUT_10_10_10_2";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_11_11_10) {
    return "ZE_IMAGE_FORMAT_LAYOUT_11_11_10";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_5_6_5) {
    return "ZE_IMAGE_FORMAT_LAYOUT_5_6_5";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_5_5_5_1) {
    return "ZE_IMAGE_FORMAT_LAYOUT_5_5_5_1";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_4_4_4_4) {
    return "ZE_IMAGE_FORMAT_LAYOUT_4_4_4_4";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_Y8) {
    return "ZE_IMAGE_FORMAT_LAYOUT_Y8";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_NV12) {
    return "ZE_IMAGE_FORMAT_LAYOUT_NV12";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_YUYV) {
    return "ZE_IMAGE_FORMAT_LAYOUT_YUYV";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_VYUY) {
    return "ZE_IMAGE_FORMAT_LAYOUT_VYUY";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_YVYU) {
    return "ZE_IMAGE_FORMAT_LAYOUT_YVYU";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_UYVY) {
    return "ZE_IMAGE_FORMAT_LAYOUT_UYVY";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_AYUV) {
    return "ZE_IMAGE_FORMAT_LAYOUT_AYUV";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_P010) {
    return "ZE_IMAGE_FORMAT_LAYOUT_P010";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_Y410) {
    return "ZE_IMAGE_FORMAT_LAYOUT_Y410";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_P012) {
    return "ZE_IMAGE_FORMAT_LAYOUT_P012";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_Y16) {
    return "ZE_IMAGE_FORMAT_LAYOUT_Y16";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_P016) {
    return "ZE_IMAGE_FORMAT_LAYOUT_P016";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_Y216) {
    return "ZE_IMAGE_FORMAT_LAYOUT_Y216";
  } else if (layout == ZE_IMAGE_FORMAT_LAYOUT_P216) {
    return "ZE_IMAGE_FORMAT_LAYOUT_P216";
  } else {
    return "Unknown ze_image_format_layout_t value: " +
           std::to_string(static_cast<int>(layout));
  }
}